

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::CoverageNameOrHierFunc::~CoverageNameOrHierFunc(CoverageNameOrHierFunc *this)

{
  CoverageNameOrHierFunc *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~CoverageNameOrHierFunc(in_RDI);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

CoverageNameOrHierFunc(KnownSystemName knownNameId, const Type& returnType,
                           unsigned int nameOrHierIndex, size_t requiredArgs = 0,
                           const std::vector<const Type*>& argTypes = {}) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), argTypes(argTypes),
        returnType(&returnType), nameOrHierIndex(nameOrHierIndex), requiredArgs(requiredArgs) {
        SLANG_ASSERT(requiredArgs <= argTypes.size());
        SLANG_ASSERT(nameOrHierIndex <= argTypes.size());
        SLANG_ASSERT(requiredArgs > nameOrHierIndex);
    }